

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BPSerializer::PutDimensionsRecord
          (BPSerializer *this,Dims *localDimensions,Dims *globalDimensions,Dims *offsets,
          vector<char,_std::allocator<char>_> *buffer)

{
  pointer puVar1;
  unsigned_long *puVar2;
  uint uVar3;
  ulong in_RAX;
  ulong uVar4;
  unsigned_long *puVar5;
  undefined8 uStack_38;
  
  if ((offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    uStack_38 = in_RAX;
    if ((globalDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (globalDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar5 = (localDimensions->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        helper::InsertU64<unsigned_long>(buffer,*puVar5);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        std::vector<char,_std::allocator<char>_>::insert
                  (buffer,(const_iterator)
                          (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish,0x10,
                   (value_type *)((long)&uStack_38 + 7));
      }
    }
    else {
      uVar3 = 0;
      while( true ) {
        uVar4 = (ulong)uVar3;
        puVar1 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(localDimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar4) break;
        helper::InsertU64<unsigned_long>(buffer,puVar1[uVar4]);
        helper::InsertU64<unsigned_long>
                  (buffer,(globalDimensions->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar4]);
        uStack_38._0_7_ = (uint7)(uint6)uStack_38;
        std::vector<char,_std::allocator<char>_>::insert
                  (buffer,(const_iterator)
                          (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish,8,(value_type *)((long)&uStack_38 + 6));
        uVar3 = uVar3 + 1;
      }
    }
  }
  else {
    uVar3 = 0;
    while( true ) {
      uVar4 = (ulong)uVar3;
      puVar1 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(localDimensions->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar4) break;
      helper::InsertU64<unsigned_long>(buffer,puVar1[uVar4]);
      helper::InsertU64<unsigned_long>
                (buffer,(globalDimensions->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
      helper::InsertU64<unsigned_long>
                (buffer,(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void BPSerializer::PutDimensionsRecord(const Dims &localDimensions, const Dims &globalDimensions,
                                       const Dims &offsets, std::vector<char> &buffer) noexcept
{
    if (offsets.empty() && globalDimensions.empty())
    { // local array
        for (const auto localDimension : localDimensions)
        {
            helper::InsertU64(buffer, localDimension);
            buffer.insert(buffer.end(), 2 * sizeof(uint64_t), '\0');
        }
    }
    else if (offsets.empty())
    { // joined array has no offsets but has global dims
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            buffer.insert(buffer.end(), sizeof(uint64_t), '\0');
        }
    }
    else
    { // global array
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            helper::InsertU64(buffer, offsets[d]);
        }
    }
}